

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * __thiscall
pbrt::GoniometricLight::Bounds(LightBounds *__return_storage_ptr__,GoniometricLight *this)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  uint local_90;
  undefined1 local_60 [32];
  size_t local_40;
  ulong local_38;
  
  TVar2 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  iVar14 = TVar2.y;
  uVar15 = TVar2.x;
  if (iVar14 < 1) {
    fVar17 = 0.0;
  }
  else {
    auVar18 = ZEXT416(0) << 0x20;
    uVar13 = 0;
    do {
      local_90 = auVar18._0_4_;
      fVar17 = sinf((((float)(int)uVar13 + 0.5) * 3.1415927) / (float)iVar14);
      if ((int)uVar15 < 1) {
        auVar18 = ZEXT416(local_90);
      }
      else {
        uVar12 = 0;
        do {
          Image::GetChannels((ImageChannelValues *)local_60,&this->image,
                             (Point2i)(uVar13 << 0x20 | uVar12),
                             (array<pbrt::WrapMode,_2>)
                             *(array<pbrt::WrapMode,_2> *)(this->wrapMode).wrap.values);
          pfVar8 = (float *)local_60._8_8_;
          if ((float *)local_60._8_8_ == (float *)0x0) {
            pfVar8 = (float *)(local_60 + 0x10);
          }
          auVar20 = ZEXT464((uint)*pfVar8);
          if (1 < local_38) {
            uVar10 = 1;
            do {
              auVar18 = vmaxss_avx(ZEXT416((uint)pfVar8[uVar10]),auVar20._0_16_);
              auVar20 = ZEXT1664(auVar18);
              uVar10 = uVar10 + 1;
            } while (local_38 != uVar10);
          }
          local_38 = 0;
          (*(*(_func_int ***)local_60._0_8_)[3])(local_60._0_8_,local_60._8_8_,local_40 << 2,4);
          auVar18 = vfmadd213ss_fma(ZEXT416(auVar20._0_4_),ZEXT416((uint)fVar17),ZEXT416(local_90));
          uVar12 = uVar12 + 1;
          local_90 = auVar18._0_4_;
        } while (uVar12 != (uVar15 & 0x7fffffff));
      }
      fVar17 = auVar18._0_4_;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (ulong)TVar2 >> 0x20);
  }
  pfVar8 = (this->I).values.ptr;
  uVar13 = (this->I).values.nStored;
  if (1 < uVar13) {
    lVar9 = uVar13 * 4 + -4;
    pfVar11 = pfVar8;
    do {
      pfVar11 = pfVar11 + 1;
      pfVar7 = pfVar11;
      if (*pfVar11 <= *pfVar8) {
        pfVar7 = pfVar8;
      }
      pfVar8 = pfVar7;
      lVar9 = lVar9 + -4;
    } while (lVar9 != 0);
  }
  auVar19 = ZEXT816(0) << 0x40;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[0][1] * 0.0))
                            ,auVar19,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]
                                            ));
  auVar18 = vfmadd231ss_fma(auVar18,auVar19,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  fVar4 = auVar18._0_4_ + (this->super_LightBase).renderFromLight.m.m[0][3];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[1][1] * 0.0))
                            ,auVar19,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]
                                            ));
  auVar18 = vfmadd231ss_fma(auVar18,auVar19,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  fVar5 = auVar18._0_4_ + (this->super_LightBase).renderFromLight.m.m[1][3];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,auVar19,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]
                                            ));
  auVar18 = vfmadd231ss_fma(auVar18,auVar19,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  fVar16 = auVar18._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar19,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0]
                                            ));
  auVar18 = vfmadd231ss_fma(auVar18,auVar19,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar6 = auVar18._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  bVar3 = fVar6 == 1.0;
  fVar16 = (float)((uint)bVar3 * (int)fVar16 + (uint)!bVar3 * (int)(fVar16 / fVar6));
  auVar18 = vinsertps_avx(ZEXT416((uint)bVar3 * (int)fVar4 + (uint)!bVar3 * (int)(fVar4 / fVar6)),
                          ZEXT416((uint)bVar3 * (int)fVar5 + (uint)!bVar3 * (int)(fVar5 / fVar6)),
                          0x10);
  fVar4 = this->scale * *pfVar8;
  uVar1 = vmovlps_avx(auVar18);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z = fVar16;
  uVar1 = vmovlps_avx(auVar18);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar16;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  __return_storage_ptr__->phi =
       (fVar17 * (fVar4 + fVar4) * 3.1415927 * 3.1415927) / (float)(int)(iVar14 * uVar15);
  __return_storage_ptr__->theta_o = 3.1415927;
  __return_storage_ptr__->theta_e = 1.5707964;
  __return_storage_ptr__->cosTheta_o = -1.0;
  __return_storage_ptr__->cosTheta_e = -4.371139e-08;
  __return_storage_ptr__->twoSided = false;
  return __return_storage_ptr__;
}

Assistant:

LightBounds GoniometricLight::Bounds() const {
    // Like Phi() method, but compute the weighted max component value of
    // the image map.
    Float weightedMaxImageSum = 0;
    int width = image.Resolution().x, height = image.Resolution().y;
    for (int v = 0; v < height; ++v) {
        Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
        for (int u = 0; u < width; ++u)
            weightedMaxImageSum +=
                sinTheta * image.GetChannels({u, v}, wrapMode).MaxValue();
    }
    Float phi =
        scale * I.MaxValue() * 2 * Pi * Pi * weightedMaxImageSum / (width * height);

    Point3f p = renderFromLight(Point3f(0, 0, 0));
    // Bound it as an isotropic point light.
    return LightBounds(p, Vector3f(0, 0, 1), phi, Pi, Pi / 2, false);
}